

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O2

ASTNode * ParseFunc(Scope *scope,Lexer *lexer)

{
  Token tok;
  int iVar1;
  ASTNode *pAVar2;
  size_t sVar3;
  char *pcVar4;
  ASTList *pAVar5;
  
  pAVar2 = GetNextNode(scope);
  pAVar2->type = FUNC;
  tok = GetNextToken(lexer);
  if (tok == IDENTIFIER) {
    sVar3 = strlen(lexer->currentTokenString);
    pcVar4 = (char *)Allocate((int)sVar3 + 1);
    (pAVar2->meta).funcExpr.name = pcVar4;
    strcpy(pcVar4,lexer->currentTokenString);
    pAVar5 = ParseParams(scope,lexer,false);
    (pAVar2->meta).funcExpr.params = pAVar5;
    iVar1 = ParseBody(scope,lexer);
    (pAVar2->meta).funcExpr.body = iVar1;
    return pAVar2;
  }
  pcVar4 = TokenToString(tok);
  printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","IDENTIFIER",pcVar4,
         (ulong)(uint)(lexer->tracker).row,
         (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
  exit(0);
}

Assistant:

ASTNode* ParseFunc(Scope* scope, Lexer* lexer){
	TRACK();
	ASTNode* func = GetNextNode(scope);
	SET_NODE_TYPE(func, FUNC);
	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, IDENTIFIER, lexer);
	DEBUG_PRINT_SYNTAX2("Func", lexer->currentTokenString);

	SET_FUNC_NAME(func, Allocate((sizeof(char) * strlen(lexer->currentTokenString)) + sizeof(char)));
	strcpy(GET_FUNC_NAME(func), lexer->currentTokenString);

	SET_FUNC_PARAMS(func, ParseParams(scope, lexer, true));
	SET_FUNC_BODY(func, ParseBody(scope, lexer));
	// SET_IS_STMT(func);
	return func;
}